

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

cram_codec * cram_huffman_decode_init(char *data,int size,cram_external_type option,int version)

{
  char *pcVar1;
  void *__base;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int32_t max_len;
  int32_t last_len;
  int32_t val;
  cram_huffman_code *codes;
  cram_codec *h;
  char *data_end;
  char *cp;
  int32_t j;
  int32_t i;
  int32_t ncodes;
  int version_local;
  cram_external_type option_local;
  int size_local;
  char *data_local;
  
  pcVar1 = data + size;
  local_5c = 0;
  if ((byte)*data < 0x80) {
    j = (int32_t)(byte)*data;
    local_60 = 1;
  }
  else {
    if ((byte)*data < 0xc0) {
      j = CONCAT11(*data,data[1]) & 0x3fff;
      local_64 = 2;
    }
    else {
      if ((byte)*data < 0xe0) {
        j = ((byte)*data & 0x1f) << 0x10 | (uint)(byte)data[1] << 8 | (uint)(byte)data[2];
        local_68 = 3;
      }
      else {
        if ((byte)*data < 0xf0) {
          j = ((byte)*data & 0xf) << 0x18 | (uint)(byte)data[1] << 0x10 | (uint)(byte)data[2] << 8 |
              (uint)(byte)data[3];
          local_6c = 4;
        }
        else {
          j = (uint)(byte)*data << 0x1c | (uint)(byte)data[1] << 0x14 | (uint)(byte)data[2] << 0xc |
              (uint)(byte)data[3] << 4 | (byte)data[4] & 0xf;
          local_6c = 5;
        }
        local_68 = local_6c;
      }
      local_64 = local_68;
    }
    local_60 = local_64;
  }
  data_end = data + local_60;
  data_local = (char *)calloc(1,0x240);
  if (data_local == (char *)0x0) {
    data_local = (char *)0x0;
  }
  else {
    *(code **)(data_local + 0x10) = cram_huffman_decode_free;
    *(int32_t *)(data_local + 0x30) = j;
    __base = malloc((long)j << 4);
    *(void **)(data_local + 0x38) = __base;
    if (__base == (void *)0x0) {
      free(data_local);
      data_local = (char *)0x0;
    }
    else {
      for (cp._4_4_ = 0; (int)cp._4_4_ < j && data_end < pcVar1; cp._4_4_ = cp._4_4_ + 1) {
        if ((byte)*data_end < 0x80) {
          *(uint *)((long)__base + (long)(int)cp._4_4_ * 0x10) = (uint)(byte)*data_end;
          local_74 = 1;
        }
        else {
          if ((byte)*data_end < 0xc0) {
            *(uint *)((long)__base + (long)(int)cp._4_4_ * 0x10) =
                 CONCAT11(*data_end,data_end[1]) & 0x3fff;
            local_78 = 2;
          }
          else {
            if ((byte)*data_end < 0xe0) {
              *(uint *)((long)__base + (long)(int)cp._4_4_ * 0x10) =
                   ((byte)*data_end & 0x1f) << 0x10 | (uint)(byte)data_end[1] << 8 |
                   (uint)(byte)data_end[2];
              local_7c = 3;
            }
            else {
              if ((byte)*data_end < 0xf0) {
                *(uint *)((long)__base + (long)(int)cp._4_4_ * 0x10) =
                     ((byte)*data_end & 0xf) << 0x18 | (uint)(byte)data_end[1] << 0x10 |
                     (uint)(byte)data_end[2] << 8 | (uint)(byte)data_end[3];
                local_80 = 4;
              }
              else {
                *(uint *)((long)__base + (long)(int)cp._4_4_ * 0x10) =
                     (uint)(byte)*data_end << 0x1c | (uint)(byte)data_end[1] << 0x14 |
                     (uint)(byte)data_end[2] << 0xc | (uint)(byte)data_end[3] << 4 |
                     (byte)data_end[4] & 0xf;
                local_80 = 5;
              }
              local_7c = local_80;
            }
            local_78 = local_7c;
          }
          local_74 = local_78;
        }
        data_end = data_end + local_74;
      }
      if (data_end < pcVar1) {
        if ((byte)*data_end < 0x80) {
          cp._4_4_ = (uint)(byte)*data_end;
          local_84 = 1;
        }
        else {
          if ((byte)*data_end < 0xc0) {
            cp._4_4_ = CONCAT11(*data_end,data_end[1]) & 0x3fff;
            local_88 = 2;
          }
          else {
            if ((byte)*data_end < 0xe0) {
              cp._4_4_ = ((byte)*data_end & 0x1f) << 0x10 | (uint)(byte)data_end[1] << 8 |
                         (uint)(byte)data_end[2];
              local_8c = 3;
            }
            else {
              if ((byte)*data_end < 0xf0) {
                cp._4_4_ = ((byte)*data_end & 0xf) << 0x18 | (uint)(byte)data_end[1] << 0x10 |
                           (uint)(byte)data_end[2] << 8 | (uint)(byte)data_end[3];
                local_90 = 4;
              }
              else {
                cp._4_4_ = (uint)(byte)*data_end << 0x1c | (uint)(byte)data_end[1] << 0x14 |
                           (uint)(byte)data_end[2] << 0xc | (uint)(byte)data_end[3] << 4 |
                           (byte)data_end[4] & 0xf;
                local_90 = 5;
              }
              local_8c = local_90;
            }
            local_88 = local_8c;
          }
          local_84 = local_88;
        }
        data_end = data_end + local_84;
        if (cp._4_4_ == j) {
          if (j != 0) {
            for (cp._4_4_ = 0; (int)cp._4_4_ < j && data_end < pcVar1; cp._4_4_ = cp._4_4_ + 1) {
              if ((byte)*data_end < 0x80) {
                *(uint *)((long)__base + (long)(int)cp._4_4_ * 0x10 + 0xc) = (uint)(byte)*data_end;
                local_98 = 1;
              }
              else {
                if ((byte)*data_end < 0xc0) {
                  *(uint *)((long)__base + (long)(int)cp._4_4_ * 0x10 + 0xc) =
                       CONCAT11(*data_end,data_end[1]) & 0x3fff;
                  local_9c = 2;
                }
                else {
                  if ((byte)*data_end < 0xe0) {
                    *(uint *)((long)__base + (long)(int)cp._4_4_ * 0x10 + 0xc) =
                         ((byte)*data_end & 0x1f) << 0x10 | (uint)(byte)data_end[1] << 8 |
                         (uint)(byte)data_end[2];
                    local_a0 = 3;
                  }
                  else {
                    if ((byte)*data_end < 0xf0) {
                      *(uint *)((long)__base + (long)(int)cp._4_4_ * 0x10 + 0xc) =
                           ((byte)*data_end & 0xf) << 0x18 | (uint)(byte)data_end[1] << 0x10 |
                           (uint)(byte)data_end[2] << 8 | (uint)(byte)data_end[3];
                      local_a4 = 4;
                    }
                    else {
                      *(uint *)((long)__base + (long)(int)cp._4_4_ * 0x10 + 0xc) =
                           (uint)(byte)*data_end << 0x1c | (uint)(byte)data_end[1] << 0x14 |
                           (uint)(byte)data_end[2] << 0xc | (uint)(byte)data_end[3] << 4 |
                           (byte)data_end[4] & 0xf;
                      local_a4 = 5;
                    }
                    local_a0 = local_a4;
                  }
                  local_9c = local_a0;
                }
                local_98 = local_9c;
              }
              data_end = data_end + local_98;
              if (local_5c < *(int *)((long)__base + (long)(int)cp._4_4_ * 0x10 + 0xc)) {
                local_5c = *(int *)((long)__base + (long)(int)cp._4_4_ * 0x10 + 0xc);
              }
            }
            if (((long)data_end - (long)data == (long)size) && (local_5c < j)) {
              qsort(__base,(long)j,0x10,code_sort);
              max_len = -1;
              local_58 = 0;
              for (cp._4_4_ = 0; (int)cp._4_4_ < j; cp._4_4_ = cp._4_4_ + 1) {
                max_len = max_len + 1;
                if (local_58 < *(int *)((long)__base + (long)(int)cp._4_4_ * 0x10 + 0xc)) {
                  for (; local_58 < *(int *)((long)__base + (long)(int)cp._4_4_ * 0x10 + 0xc);
                      local_58 = local_58 + 1) {
                    max_len = max_len << 1;
                  }
                }
                *(int32_t *)((long)__base + (long)(int)cp._4_4_ * 0x10 + 8) = max_len;
              }
              local_58 = 0;
              cp._0_4_ = 0;
              for (cp._4_4_ = 0; (int)cp._4_4_ < j; cp._4_4_ = cp._4_4_ + 1) {
                if (local_58 < *(int *)((long)__base + (long)(int)cp._4_4_ * 0x10 + 0xc)) {
                  cp._0_4_ = *(int *)((long)__base + (long)(int)cp._4_4_ * 0x10 + 8) - cp._4_4_;
                  local_58 = *(int *)((long)__base + (long)(int)cp._4_4_ * 0x10 + 0xc);
                }
                *(int *)((long)__base + (long)(int)cp._4_4_ * 0x10 + 4) = (int)cp;
              }
              data_local[0] = '\x03';
              data_local[1] = '\0';
              data_local[2] = '\0';
              data_local[3] = '\0';
              if ((option == E_BYTE) || (option == E_BYTE_ARRAY)) {
                if (*(int *)(*(long *)(data_local + 0x38) + 0xc) == 0) {
                  *(code **)(data_local + 0x18) = cram_huffman_decode_char0;
                }
                else {
                  *(code **)(data_local + 0x18) = cram_huffman_decode_char;
                }
              }
              else {
                if (option == E_BYTE_ARRAY_BLOCK) {
                  abort();
                }
                if (*(int *)(*(long *)(data_local + 0x38) + 0xc) == 0) {
                  *(code **)(data_local + 0x18) = cram_huffman_decode_int0;
                }
                else {
                  *(code **)(data_local + 0x18) = cram_huffman_decode_int;
                }
              }
            }
            else {
              fprintf(_stderr,"Malformed huffman header stream\n");
              free(data_local);
              data_local = (char *)0x0;
            }
          }
        }
        else {
          fprintf(_stderr,"Malformed huffman header stream\n");
          free(data_local);
          data_local = (char *)0x0;
        }
      }
      else {
        fprintf(_stderr,"Malformed huffman header stream\n");
        free(data_local);
        data_local = (char *)0x0;
      }
    }
  }
  return (cram_codec *)data_local;
}

Assistant:

cram_codec *cram_huffman_decode_init(char *data, int size,
				     enum cram_external_type option,
				     int version) {
    int32_t ncodes, i, j;
    char *cp = data, *data_end = &data[size];
    cram_codec *h;
    cram_huffman_code *codes;
    int32_t val, last_len, max_len = 0;
    
    cp += itf8_get(cp, &ncodes);
    h = calloc(1, sizeof(*h));
    if (!h)
	return NULL;

    h->free   = cram_huffman_decode_free;

    h->huffman.ncodes = ncodes;
    codes = h->huffman.codes = malloc(ncodes * sizeof(*codes));
    if (!codes) {
	free(h);
	return NULL;
    }

    /* Read symbols and bit-lengths */
    for (i = 0; i < ncodes && cp < data_end; i++) {
	cp += itf8_get(cp, &codes[i].symbol);
    }

    if (cp >= data_end) {
	fprintf(stderr, "Malformed huffman header stream\n");
	free(h);
	return NULL;
    }
    cp += itf8_get(cp, &i);
    if (i != ncodes) {
	fprintf(stderr, "Malformed huffman header stream\n");
	free(h);
	return NULL;
    }

    if (ncodes == 0) {
	/* NULL huffman stream */
	return h;
    }

    for (i = 0; i < ncodes && cp < data_end; i++) {
	cp += itf8_get(cp, &codes[i].len);
	if (max_len < codes[i].len)
	    max_len = codes[i].len;
    }
    if (cp - data != size || max_len >= ncodes) {
	fprintf(stderr, "Malformed huffman header stream\n");
	free(h);
	return NULL;
    }

    /* Sort by bit length and then by symbol value */
    qsort(codes, ncodes, sizeof(*codes), code_sort);

    /* Assign canonical codes */
    val = -1, last_len = 0;
    for (i = 0; i < ncodes; i++) {
	val++;
	if (codes[i].len > last_len) {
	    while (codes[i].len > last_len) {
		val <<= 1;
		last_len++;
	    }
	}
	codes[i].code = val;
    }

    /*
     * Compute the next starting point, offset by the i'th value.
     * For example if codes 10, 11, 12, 13 are 30, 31, 32, 33 then
     * codes[10..13].p = 30 - 10.
     */
    last_len = 0;
    for (i = j = 0; i < ncodes; i++) {
	if (codes[i].len > last_len) {
	    j = codes[i].code - i;
	    last_len = codes[i].len;
	}
	codes[i].p = j;
    }

//    puts("==HUFF LEN==");
//    for (i = 0; i <= last_len+1; i++) {
//	printf("len %d=%d prefix %d\n", i, h->huffman.lengths[i], h->huffman.prefix[i]); 
//    }
//    puts("===HUFFMAN CODES===");
//    for (i = 0; i < ncodes; i++) {
//	int j;
//	printf("%d: %d %d %d ", i, codes[i].symbol, codes[i].len, codes[i].code);
//	j = codes[i].len;
//	while (j) {
//	    putchar(codes[i].code & (1 << --j) ? '1' : '0');
//	}
//	printf(" %d\n", codes[i].code);
//    }

    h->codec  = E_HUFFMAN;
    if (option == E_BYTE || option == E_BYTE_ARRAY) {
	if (h->huffman.codes[0].len == 0)
	    h->decode = cram_huffman_decode_char0;
	else
	    h->decode = cram_huffman_decode_char;
    } else if (option == E_BYTE_ARRAY_BLOCK) {
	abort();
    } else {
	if (h->huffman.codes[0].len == 0)
	    h->decode = cram_huffman_decode_int0;
	else
	    h->decode = cram_huffman_decode_int;
    }

    return (cram_codec *)h;
}